

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::
DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
           *this,int num_args,ArgHandler *arg_handler)

{
  Expr *in_RDX;
  int in_ESI;
  LogicalExprReader *in_RDI;
  int i;
  LogicalExprReader expr_reader;
  Expr *arg;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *r;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  local_40;
  int local_20;
  Expr *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  for (local_20 = 0; local_20 < local_c; local_20 = local_20 + 1) {
    r = &local_40;
    arg = local_18;
    LogicalExprReader::Read_abi_cxx11_(in_RDI,r);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::ArgHandler::AddArg((ArgHandler *)r,arg);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void DoReadArgs(int num_args, ArgHandler &arg_handler) {
    ExprReader expr_reader;
    for (int i = 0; i < num_args; ++i)
      arg_handler.AddArg(expr_reader.Read(*this));
  }